

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcCostItem::~IfcCostItem(IfcCostItem *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)&(this->super_IfcControl).super_IfcObject = 0x8941e0;
  *(undefined8 *)&(this->super_IfcControl).field_0xf0 = 0x894258;
  *(undefined8 *)&(this->super_IfcControl).super_IfcObject.field_0x88 = 0x894208;
  (this->super_IfcControl).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x894230;
  puVar2 = *(undefined1 **)
            &(this->super_IfcControl).super_IfcObject.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x10;
  puVar1 = &(this->super_IfcControl).super_IfcObject.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  *(undefined8 *)&(this->super_IfcControl).super_IfcObject = 0x8942f8;
  *(undefined8 *)&(this->super_IfcControl).field_0xf0 = 0x894320;
  puVar2 = *(undefined1 **)&(this->super_IfcControl).super_IfcObject.field_0x60;
  puVar1 = &(this->super_IfcControl).super_IfcObject.field_0x70;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar2 = *(undefined1 **)&(this->super_IfcControl).super_IfcObject.field_0x38;
  puVar1 = &(this->super_IfcControl).super_IfcObject.field_0x48;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar2 = *(undefined1 **)&(this->super_IfcControl).super_IfcObject.field_0x10;
  puVar1 = &(this->super_IfcControl).super_IfcObject.field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  operator_delete(this,0x108);
  return;
}

Assistant:

IfcCostItem() : Object("IfcCostItem") {}